

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

void __thiscall
Lib::
DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
::expand(DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Entry *__ptr;
  Entry *pEVar5;
  void *placement;
  Entry *pEVar6;
  Exception *this_00;
  TermSpec val;
  
  if (0x1c < (long)this->_capacityIndex) {
    this_00 = (Exception *)__cxa_allocate_exception(0x28);
    Lib::Exception::Exception(this_00,"Lib::DHMap::expand: MaxCapacityIndex reached.");
    __cxa_throw(this_00,&Lib::Exception::typeinfo,Lib::Exception::~Exception);
  }
  iVar1 = *(int *)(DHMapTableCapacities + (long)this->_capacityIndex * 4 + 4);
  placement = Lib::alloc((long)iVar1 << 5);
  __ptr = this->_entries;
  pEVar5 = this->_afterLast;
  uVar2 = this->_timestamp;
  iVar3 = this->_capacity;
  this->_timestamp = 1;
  this->_size = 0;
  this->_deleted = 0;
  iVar4 = this->_capacityIndex;
  this->_capacityIndex = iVar4 + 1;
  this->_capacity = iVar1;
  this->_nextExpansionOccupancy = *(int *)(DHMapTableNextExpansions + (long)iVar4 * 4 + 4);
  pEVar6 = array_new<Lib::DHMap<Kernel::TermList,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                     (placement,(long)iVar1);
  this->_entries = pEVar6;
  this->_afterLast = pEVar6 + this->_capacity;
  for (pEVar6 = __ptr; pEVar6 != pEVar5; pEVar6 = pEVar6 + 1) {
    if (((pEVar6->field_0)._infoData & 1U) == 0 && (uint)(pEVar6->field_0)._infoData >> 2 == uVar2)
    {
      val._4_4_ = 0;
      val.q = (pEVar6->_val).q;
      val._1_3_ = *(undefined3 *)&(pEVar6->_val).field_0x1;
      val.t._content = (pEVar6->_val).t._content;
      insert(this,(TermList)(pEVar6->_key)._content,val);
    }
  }
  if (iVar3 != 0) {
    Lib::free(__ptr);
    return;
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }